

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void bhdct_run_tests(ion_handler_initializer_t init_fcn,ion_dictionary_size_t dictionary_size,
                    uint32_t test_classes)

{
  planck_unit_suite_t *ppVar1;
  
  bhdct_context.init_fcn = init_fcn;
  bhdct_context.dictionary_size = dictionary_size;
  bhdct_context.test_classes = test_classes;
  if ((test_classes & 1) != 0) {
    ppVar1 = planck_unit_new_suite();
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_setup,"test_bhdct_setup",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_insert_single,"test_bhdct_insert_single",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_insert_multiple,"test_bhdct_insert_multiple",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_get_single,"test_bhdct_get_single",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_get_in_many,"test_bhdct_get_in_many",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_get_lots,"test_bhdct_get_lots",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_get_nonexist_empty,"test_bhdct_get_nonexist_empty",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_get_nonexist_single,"test_bhdct_get_nonexist_single",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_get_nonexist_many,"test_bhdct_get_nonexist_many",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_get_exist_single,"test_bhdct_get_exist_single",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_get_populated_single,"test_bhdct_get_populated_single",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_get_populated_multiple,"test_bhdct_get_populated_multiple",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_get_all,"test_bhdct_get_all",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_delete_empty,"test_bhdct_delete_empty",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_delete_nonexist_single,"test_bhdct_delete_nonexist_single",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_delete_nonexist_several,"test_bhdct_delete_nonexist_several",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_delete_single,"test_bhdct_delete_single",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_delete_single_several,"test_bhdct_delete_single_several",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_delete_all,"test_bhdct_delete_all",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_update_empty_single,"test_bhdct_update_empty_single",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_update_nonexist_single,"test_bhdct_update_nonexist_single",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_update_nonexist_in_many,"test_bhdct_update_nonexist_in_many",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_update_exist_single,"test_bhdct_update_exist_single",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_update_exist_in_many,"test_bhdct_update_exist_in_many",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_update_all,"test_bhdct_update_all",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_add_to_suite
              (ppVar1,test_bhdct_delete_then_insert,"test_bhdct_delete_then_insert",
               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
              );
    planck_unit_run_suite(ppVar1);
    planck_unit_destroy_suite(ppVar1);
  }
  if ((bhdct_context.test_classes & 2) == 0) {
    return;
  }
  ppVar1 = planck_unit_new_suite();
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_setup_string_key,"test_bhdct_setup_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_insert_single_string_key,"test_bhdct_insert_single_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_insert_multiple_string_key,"test_bhdct_insert_multiple_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_get_single_string_key,"test_bhdct_get_single_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_get_in_many_string_key,"test_bhdct_get_in_many_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_get_lots_string_key,"test_bhdct_get_lots_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_get_nonexist_empty_string_key,
             "test_bhdct_get_nonexist_empty_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_get_nonexist_single_string_key,
             "test_bhdct_get_nonexist_single_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_get_nonexist_many_string_key,
             "test_bhdct_get_nonexist_many_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_get_exist_single_string_key,"test_bhdct_get_exist_single_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_get_populated_single_string_key,
             "test_bhdct_get_populated_single_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_get_populated_multiple_string_key,
             "test_bhdct_get_populated_multiple_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_get_all_string_key,"test_bhdct_get_all_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_delete_empty_string_key,"test_bhdct_delete_empty_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_delete_nonexist_single_string_key,
             "test_bhdct_delete_nonexist_single_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_delete_nonexist_several_string_key,
             "test_bhdct_delete_nonexist_several_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_delete_single_string_key,"test_bhdct_delete_single_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_delete_single_several_string_key,
             "test_bhdct_delete_single_several_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_delete_all_string_key,"test_bhdct_delete_all_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_update_empty_single_string_key,
             "test_bhdct_update_empty_single_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_update_nonexist_single_string_key,
             "test_bhdct_update_nonexist_single_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_update_nonexist_in_many_string_key,
             "test_bhdct_update_nonexist_in_many_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_update_exist_single_string_key,
             "test_bhdct_update_exist_single_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_update_exist_in_many_string_key,
             "test_bhdct_update_exist_in_many_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_update_all_string_key,"test_bhdct_update_all_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_add_to_suite
            (ppVar1,test_bhdct_delete_then_insert_string_key,
             "test_bhdct_delete_then_insert_string_key",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
            );
  planck_unit_run_suite(ppVar1);
  planck_unit_destroy_suite(ppVar1);
  return;
}

Assistant:

void
bhdct_run_tests(
	ion_handler_initializer_t	init_fcn,
	ion_dictionary_size_t		dictionary_size,
	uint32_t					test_classes
) {
	bhdct_context.init_fcn			= init_fcn;
	bhdct_context.dictionary_size	= dictionary_size;
	bhdct_context.test_classes		= test_classes;

	if (bhdct_context.test_classes & ION_BHDCT_INT_INT) {
		planck_unit_suite_t *suite = planck_unit_new_suite();

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_setup);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_insert_single);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_insert_multiple);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_single);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_in_many);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_lots);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_nonexist_empty);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_nonexist_single);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_nonexist_many);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_exist_single);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_populated_single);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_populated_multiple);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_all);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_empty);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_nonexist_single);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_nonexist_several);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_single);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_single_several);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_all);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_empty_single);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_nonexist_single);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_nonexist_in_many);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_exist_single);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_exist_in_many);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_all);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_then_insert);

		planck_unit_run_suite(suite);
		planck_unit_destroy_suite(suite);
	}

	if (bhdct_context.test_classes & ION_BHDCT_STRING_INT) {
		planck_unit_suite_t *suite = planck_unit_new_suite();

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_setup_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_insert_single_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_insert_multiple_string_key);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_single_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_in_many_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_lots_string_key);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_nonexist_empty_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_nonexist_single_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_nonexist_many_string_key);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_exist_single_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_populated_single_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_populated_multiple_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_get_all_string_key);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_empty_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_nonexist_single_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_nonexist_several_string_key);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_single_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_single_several_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_all_string_key);

		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_empty_single_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_nonexist_single_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_nonexist_in_many_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_exist_single_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_exist_in_many_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_update_all_string_key);
		PLANCK_UNIT_ADD_TO_SUITE(suite, test_bhdct_delete_then_insert_string_key);

		planck_unit_run_suite(suite);
		planck_unit_destroy_suite(suite);
	}
}